

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstHoisting.cpp
# Opt level: O0

Expression * __thiscall
wasm::ConstHoisting::hoist
          (ConstHoisting *this,
          vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *vec)

{
  Expression **ppEVar1;
  bool bVar2;
  Index index;
  reference pppEVar3;
  Module *wasm;
  Function *func;
  LocalSet *pLVar4;
  reference pppEVar5;
  LocalGet *pLVar6;
  Expression **item;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *__range2;
  LocalSet *ret;
  Index temp;
  Builder builder;
  Type type;
  vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *vec_local;
  ConstHoisting *this_local;
  
  pppEVar3 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::operator[]
                       (vec,0);
  builder.wasm = (Module *)((**pppEVar3)->type).id;
  wasm = Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>::getModule
                   (&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
                     ).
                     super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>
                     .super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>);
  Builder::Builder((Builder *)&stack0xffffffffffffffd8,wasm);
  func = Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>::getFunction
                   (&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>_>
                     ).
                     super_PostWalker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>
                     .super_Walker<wasm::ConstHoisting,_wasm::Visitor<wasm::ConstHoisting,_void>_>);
  index = Builder::addVar(func,(Type)builder.wasm);
  pppEVar3 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::operator[]
                       (vec,0);
  pLVar4 = Builder::makeLocalSet((Builder *)&stack0xffffffffffffffd8,index,**pppEVar3);
  __end2 = std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::begin(vec);
  item = (Expression **)
         std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::end(vec);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
                                *)&item);
    if (!bVar2) break;
    pppEVar5 = __gnu_cxx::
               __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
               ::operator*(&__end2);
    ppEVar1 = *pppEVar5;
    pLVar6 = Builder::makeLocalGet((Builder *)&stack0xffffffffffffffd8,index,(Type)builder.wasm);
    *ppEVar1 = (Expression *)pLVar6;
    __gnu_cxx::
    __normal_iterator<wasm::Expression_***,_std::vector<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>_>
    ::operator++(&__end2);
  }
  return (Expression *)pLVar4;
}

Assistant:

Expression* hoist(std::vector<Expression**>& vec) {
    auto type = (*(vec[0]))->type;
    Builder builder(*getModule());
    auto temp = builder.addVar(getFunction(), type);
    auto* ret = builder.makeLocalSet(temp, *(vec[0]));
    for (auto item : vec) {
      *item = builder.makeLocalGet(temp, type);
    }
    return ret;
  }